

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O2

int send_event(int event,Fl_Widget *to,Fl_Window *window)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Fl_Group *pFVar5;
  int iVar6;
  
  iVar3 = Fl::e_y;
  iVar2 = Fl::e_x;
  iVar1 = Fl::e_number;
  pFVar5 = (Fl_Group *)to;
  if (window == (Fl_Window *)0x0) {
    iVar4 = 0;
    iVar6 = 0;
  }
  else {
    iVar6 = (window->super_Fl_Group).super_Fl_Widget.x_;
    iVar4 = (window->super_Fl_Group).super_Fl_Widget.y_;
  }
  for (; pFVar5 != (Fl_Group *)0x0; pFVar5 = *(Fl_Group **)((long)&pFVar5->super_Fl_Widget + 8)) {
    if (0xef < *(uchar *)((long)&pFVar5->super_Fl_Widget + 0x6c)) {
      iVar6 = iVar6 - *(int *)((long)&pFVar5->super_Fl_Widget + 0x20);
      iVar4 = iVar4 - *(int *)((long)&pFVar5->super_Fl_Widget + 0x24);
    }
  }
  Fl::e_x = iVar6 + Fl::e_x;
  Fl::e_y = iVar4 + Fl::e_y;
  Fl::e_number = event;
  iVar6 = (*to->_vptr_Fl_Widget[3])(to);
  Fl::e_number = iVar1;
  Fl::e_y = iVar3;
  Fl::e_x = iVar2;
  return iVar6;
}

Assistant:

static int send_event(int event, Fl_Widget* to, Fl_Window* window) {
  int dx, dy;
  int old_event = Fl::e_number;
  if (window) {
    dx = window->x();
    dy = window->y();
  } else {
    dx = dy = 0;
  }
  for (const Fl_Widget* w = to; w; w = w->parent())
    if (w->type()>=FL_WINDOW) {dx -= w->x(); dy -= w->y();}
  int save_x = Fl::e_x; Fl::e_x += dx;
  int save_y = Fl::e_y; Fl::e_y += dy;
  int ret = to->handle(Fl::e_number = event);
  Fl::e_number = old_event;
  Fl::e_y = save_y;
  Fl::e_x = save_x;
  return ret;
}